

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O2

void __thiscall network_pimpl::remove_client(network_pimpl *this,string *value)

{
  __type _Var1;
  iterator __position;
  iterator __position_00;
  string local_50;
  
  __position._M_current =
       (this->events).super__Vector_base<EventDataType,_std::allocator<EventDataType>_>._M_impl.
       super__Vector_impl_data._M_start;
  while (__position._M_current !=
         (this->events).super__Vector_base<EventDataType,_std::allocator<EventDataType>_>._M_impl.
         super__Vector_impl_data._M_finish) {
    EventDataType::getOrigin_abi_cxx11_(&local_50,__position._M_current);
    _Var1 = std::operator==(&local_50,value);
    std::__cxx11::string::~string((string *)&local_50);
    if (_Var1) {
      __position = std::vector<EventDataType,_std::allocator<EventDataType>_>::erase
                             (&this->events,__position._M_current);
    }
    else {
      __position._M_current = __position._M_current + 1;
    }
  }
  __position_00._M_current =
       (this->hfdts).super__Vector_base<HighFreqDataType,_std::allocator<HighFreqDataType>_>._M_impl
       .super__Vector_impl_data._M_start;
  while (__position_00._M_current !=
         (this->hfdts).super__Vector_base<HighFreqDataType,_std::allocator<HighFreqDataType>_>.
         _M_impl.super__Vector_impl_data._M_finish) {
    HighFreqDataType::getOrigin_abi_cxx11_(&local_50,__position_00._M_current);
    _Var1 = std::operator==(&local_50,value);
    std::__cxx11::string::~string((string *)&local_50);
    if (_Var1) {
      __position_00 =
           std::vector<HighFreqDataType,_std::allocator<HighFreqDataType>_>::erase
                     (&this->hfdts,__position_00._M_current);
    }
    else {
      __position_00._M_current = __position_00._M_current + 1;
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(&(this->clients)._M_t,value);
  return;
}

Assistant:

void network_pimpl::remove_client(const std::string &value){
    //First remove all events and hfdt's related to this client
    for(auto it = events.begin(); it != events.end(); ){
        if(it->getOrigin() == value)
            it = events.erase(it);
        else ++it;
    }
    //Remove hfdt's
    for(auto it = hfdts.begin(); it != hfdts.end(); ){
        if(it->getOrigin() == value)
            it = hfdts.erase(it);
        else ++it;
    }
    //Remove name from clients
    clients.erase(value);
}